

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

void Abc_AigRehash(Abc_Aig_t *pMan)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  Abc_Obj_t **ppAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p1;
  long lVar6;
  int iVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pObj;
  ulong uVar9;
  
  uVar9 = (ulong)pMan->nBins;
  ppAVar4 = (Abc_Obj_t **)calloc(1,uVar9 << 3);
  iVar7 = 0;
  for (lVar6 = 0; lVar6 < (int)uVar9; lVar6 = lVar6 + 1) {
    pAVar8 = pMan->pBins[lVar6];
    if (pAVar8 != (Abc_Obj_t *)0x0) goto LAB_00694411;
    pAVar5 = (Abc_Obj_t *)0x0;
    pObj = pAVar8;
    while (pAVar8 = pAVar5, pObj != (Abc_Obj_t *)0x0) {
      piVar2 = (pObj->vFanins).pArray;
      iVar1 = *piVar2;
      if (piVar2[1] < iVar1) {
        *piVar2 = piVar2[1];
        piVar2[1] = iVar1;
        uVar3 = *(uint *)&pObj->field_0x14;
        *(uint *)&pObj->field_0x14 = (uVar3 & 0xfffff3ff | uVar3 >> 1 & 0x400) + (uVar3 & 0x400) * 2
        ;
        uVar9 = (ulong)(uint)pMan->nBins;
      }
      pAVar5 = Abc_ObjChild0(pObj);
      p1 = Abc_ObjChild1(pObj);
      uVar3 = Abc_HashKey2(pAVar5,p1,(int)uVar9);
      pObj->pNext = ppAVar4[uVar3];
      ppAVar4[uVar3] = pObj;
      iVar7 = iVar7 + 1;
      pAVar5 = (Abc_Obj_t *)0x0;
      pObj = pAVar8;
      if (pAVar8 != (Abc_Obj_t *)0x0) {
LAB_00694411:
        pAVar5 = pAVar8->pNext;
        pObj = pAVar8;
      }
    }
  }
  if (iVar7 != pMan->nEntries) {
    __assert_fail("Counter == pMan->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x295,"void Abc_AigRehash(Abc_Aig_t *)");
  }
  free(pMan->pBins);
  pMan->pBins = ppAVar4;
  return;
}

Assistant:

void Abc_AigRehash( Abc_Aig_t * pMan )
{
    Abc_Obj_t ** pBinsNew;
    Abc_Obj_t * pEnt, * pEnt2;
    int * pArray;
    unsigned Key;
    int Counter, Temp, i;

    // allocate a new array
    pBinsNew = ABC_ALLOC( Abc_Obj_t *, pMan->nBins );
    memset( pBinsNew, 0, sizeof(Abc_Obj_t *) * pMan->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntrySafe( pMan->pBins[i], pEnt, pEnt2 )
        {
            // swap the fanins if needed
            pArray = pEnt->vFanins.pArray;
            if ( pArray[0] > pArray[1] )
            {
                Temp = pArray[0];
                pArray[0] = pArray[1];
                pArray[1] = Temp;
                Temp = pEnt->fCompl0;
                pEnt->fCompl0 = pEnt->fCompl1;
                pEnt->fCompl1 = Temp;
            }
            // rehash the node
            Key = Abc_HashKey2( Abc_ObjChild0(pEnt), Abc_ObjChild1(pEnt), pMan->nBins );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == pMan->nEntries );
    // replace the table and the parameters
    ABC_FREE( pMan->pBins );
    pMan->pBins = pBinsNew;
}